

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidBranch(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *this;
  FeatureType *pFVar3;
  ArrayFeatureType *this_00;
  ActivationParams *pAVar4;
  NeuralNetwork *pNVar5;
  ostream *poVar6;
  Result local_170;
  BranchLayerParams *branch_layer;
  NeuralNetworkLayer *l4;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l2;
  NeuralNetwork nnElse;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnIf;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnIf._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnIf._80_8_,"B");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnIf._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  nnElse._80_8_ = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)nnElse._80_8_);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnElse._80_8_,"if_relu")
  ;
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnElse._80_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnElse._80_8_,"B");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l2);
  nnMain = (NeuralNetwork *)CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l2);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)nnMain);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnMain,"else_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnMain,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnMain,"B");
  l3 = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)l3,EXACT_ARRAY_MAPPING);
  l4 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(l4);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(l4,"condition_producing_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(l4,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(l4,"cond");
  branch_layer = (BranchLayerParams *)
                 CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  local_170.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_branch((NeuralNetworkLayer *)branch_layer)
  ;
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)branch_layer,"branch_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)branch_layer,"cond");
  pNVar5 = CoreML::Specification::BranchLayerParams::mutable_ifbranch
                     ((BranchLayerParams *)local_170.m_message._M_storage._M_storage);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar5,(NeuralNetwork *)&l1);
  pNVar5 = CoreML::Specification::BranchLayerParams::mutable_elsebranch
                     ((BranchLayerParams *)local_170.m_message._M_storage._M_storage);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar5,(NeuralNetwork *)&l2);
  CoreML::validate<(MLModelType)500>(&local_170,(Model *)&topIn);
  bVar1 = CoreML::Result::good(&local_170);
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10e6);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  m._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result(&local_170);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l2);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testValidBranch() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // "else" net
    Specification::NeuralNetwork nnElse;
    auto *l2 = nnElse.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("else_relu");
    l2->add_input("A");
    l2->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    branch_layer->mutable_elsebranch()->CopyFrom(nnElse);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_GOOD(res);
    return 0;
}